

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::builtin_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,BuiltIn builtin,StorageClass storage)

{
  bool bVar1;
  uint uVar2;
  SPIREntryPoint *pSVar3;
  CompilerError *pCVar4;
  byte bVar5;
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  char *pcVar6;
  allocator local_39;
  string local_38;
  
  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &switchD_0021fe63::switchdataD_003037b8;
  switch(builtin) {
  case BuiltInPosition:
    pcVar6 = "gl_Position";
    break;
  case BuiltInPointSize:
    pcVar6 = "gl_PointSize";
    break;
  case 2:
  case BuiltInPatchVertices:
  case BuiltInSampleMask|BuiltInPointSize:
  case BuiltInWorkDim:
  case BuiltInGlobalSize:
  case BuiltInEnqueuedWorkgroupSize:
  case BuiltInGlobalOffset:
  case BuiltInGlobalLinearId:
  case BuiltInGlobalLinearId|BuiltInPointSize:
  case BuiltInSubgroupMaxSize:
  case BuiltInNumEnqueuedSubgroups:
switchD_0021fe63_caseD_2:
    ::std::__cxx11::to_string(&local_38,builtin);
    join<char_const(&)[12],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)"gl_BuiltIn_",(char (*) [12])&local_38,ts_1);
    ::std::__cxx11::string::~string((string *)&local_38);
    return __return_storage_ptr__;
  case BuiltInClipDistance:
    pcVar6 = "gl_ClipDistance";
    break;
  case BuiltInCullDistance:
    pcVar6 = "gl_CullDistance";
    break;
  case BuiltInVertexId:
    if ((this->options).vulkan_semantics == true) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,
                 "Cannot implement gl_VertexID in Vulkan GLSL. This shader was created with GL semantics."
                 ,&local_39);
      CompilerError::CompilerError(pCVar4,&local_38);
      __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_0022021b;
  case BuiltInInstanceId:
    if (((this->options).vulkan_semantics == true) &&
       (pSVar3 = Compiler::get_entry_point(&this->super_Compiler),
       2 < pSVar3->model - ExecutionModelIntersectionKHR)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,
                 "Cannot implement gl_InstanceID in Vulkan GLSL. This shader was created with GL semantics."
                 ,&local_39);
      CompilerError::CompilerError(pCVar4,&local_38);
      __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((this->options).es == false) && ((this->options).version < 0x8c)) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_ARB_draw_instanced",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    goto LAB_00220718;
  case BuiltInPrimitiveId:
    if ((storage == StorageClassInput) &&
       (pSVar3 = Compiler::get_entry_point(&this->super_Compiler),
       pSVar3->model == ExecutionModelGeometry)) {
      pcVar6 = "gl_PrimitiveIDIn";
    }
    else {
      pcVar6 = "gl_PrimitiveID";
    }
    break;
  case BuiltInInvocationId:
    pcVar6 = "gl_InvocationID";
    break;
  case BuiltInLayer:
    pcVar6 = "gl_Layer";
    break;
  case BuiltInViewportIndex:
    pcVar6 = "gl_ViewportIndex";
    break;
  case BuiltInTessLevelOuter:
    pcVar6 = "gl_TessLevelOuter";
    break;
  case BuiltInTessLevelInner:
    pcVar6 = "gl_TessLevelInner";
    break;
  case BuiltInTessCoord:
    pcVar6 = "gl_TessCoord";
    break;
  case BuiltInFragCoord:
    pcVar6 = "gl_FragCoord";
    break;
  case BuiltInPointCoord:
    pcVar6 = "gl_PointCoord";
    break;
  case BuiltInFrontFacing:
    pcVar6 = "gl_FrontFacing";
    break;
  case BuiltInSampleId:
    bVar5 = (this->options).es;
    uVar2 = (this->options).version;
    if ((uVar2 < 0x140 & bVar5) == 1) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_OES_sample_variables",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
      bVar5 = (this->options).es;
      uVar2 = (this->options).version;
    }
    if (((bVar5 & 1) == 0) && (uVar2 < 400)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"gl_SampleID not supported before GLSL 400.",&local_39);
      CompilerError::CompilerError(pCVar4,&local_38);
      __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar6 = "gl_SampleID";
    break;
  case BuiltInSamplePosition:
    bVar5 = (this->options).es;
    uVar2 = (this->options).version;
    if ((uVar2 < 0x140 & bVar5) == 1) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_OES_sample_variables",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
      bVar5 = (this->options).es;
      uVar2 = (this->options).version;
    }
    if (((bVar5 & 1) == 0) && (uVar2 < 400)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"gl_SamplePosition not supported before GLSL 400.",&local_39);
      CompilerError::CompilerError(pCVar4,&local_38);
      __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar6 = "gl_SamplePosition";
    break;
  case BuiltInSampleMask:
    bVar5 = (this->options).es;
    uVar2 = (this->options).version;
    if ((uVar2 < 0x140 & bVar5) == 1) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_OES_sample_variables",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
      bVar5 = (this->options).es;
      uVar2 = (this->options).version;
    }
    if (((bVar5 & 1) == 0) && (uVar2 < 400)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"gl_SampleMask/gl_SampleMaskIn not supported before GLSL 400.",
                 &local_39);
      CompilerError::CompilerError(pCVar4,&local_38);
      __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (storage == StorageClassInput) {
      pcVar6 = "gl_SampleMaskIn";
    }
    else {
      pcVar6 = "gl_SampleMask";
    }
    break;
  case BuiltInFragDepth:
    pcVar6 = "gl_FragDepth";
    break;
  case BuiltInHelperInvocation:
    pcVar6 = "gl_HelperInvocation";
    break;
  case BuiltInNumWorkgroups:
    pcVar6 = "gl_NumWorkGroups";
    break;
  case BuiltInWorkgroupSize:
    pcVar6 = "gl_WorkGroupSize";
    break;
  case BuiltInWorkgroupId:
    pcVar6 = "gl_WorkGroupID";
    break;
  case BuiltInLocalInvocationId:
    pcVar6 = "gl_LocalInvocationID";
    break;
  case BuiltInGlobalInvocationId:
    pcVar6 = "gl_GlobalInvocationID";
    break;
  case BuiltInLocalInvocationIndex:
    pcVar6 = "gl_LocalInvocationIndex";
    break;
  case BuiltInSubgroupSize:
    request_subgroup_feature(this,SubgroupSize);
    pcVar6 = "gl_SubgroupSize";
    break;
  case BuiltInNumSubgroups:
    request_subgroup_feature(this,NumSubgroups);
    pcVar6 = "gl_NumSubgroups";
    break;
  case BuiltInSubgroupId:
    request_subgroup_feature(this,SubgroupID);
    pcVar6 = "gl_SubgroupID";
    break;
  case BuiltInSubgroupLocalInvocationId:
    request_subgroup_feature(this,SubgroupInvocationID);
    pcVar6 = "gl_SubgroupInvocationID";
    break;
  case BuiltInVertexIndex:
    if ((this->options).vulkan_semantics == true) {
      pcVar6 = "gl_VertexIndex";
      break;
    }
LAB_0022021b:
    pcVar6 = "gl_VertexID";
    break;
  case BuiltInInstanceIndex:
    if ((this->options).vulkan_semantics == true) {
      pcVar6 = "gl_InstanceIndex";
      break;
    }
    if (((this->options).es == false) && ((this->options).version < 0x8c)) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_ARB_draw_instanced",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    if ((this->options).vertex.support_nonzero_base_instance == true) {
      if ((this->options).vulkan_semantics == false) {
        ::std::__cxx11::string::string
                  ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
      }
      pcVar6 = "(gl_InstanceID + SPIRV_Cross_BaseInstance)";
      break;
    }
LAB_00220718:
    pcVar6 = "gl_InstanceID";
    break;
  default:
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &switchD_0021fe8a::switchdataD_003038cc;
    switch(builtin) {
    case BuiltInLaunchIdKHR:
      pcVar6 = "gl_LaunchIDNV";
      break;
    case BuiltInLaunchSizeKHR:
      pcVar6 = "gl_LaunchSizeNV";
      break;
    case BuiltInWorldRayOriginKHR:
      pcVar6 = "gl_WorldRayOriginNV";
      break;
    case BuiltInWorldRayDirectionKHR:
      pcVar6 = "gl_WorldRayDirectionNV";
      break;
    case BuiltInObjectRayOriginKHR:
      pcVar6 = "gl_ObjectRayOriginNV";
      break;
    case BuiltInObjectRayDirectionKHR:
      pcVar6 = "gl_ObjectRayDirectionNV";
      break;
    case BuiltInRayTminKHR:
      pcVar6 = "gl_RayTminNV";
      break;
    case BuiltInRayTmaxKHR:
      pcVar6 = "gl_RayTmaxNV";
      break;
    case BuiltInInstanceCustomIndexKHR:
      pcVar6 = "gl_InstanceCustomIndexNV";
      break;
    case 0x14d0:
    case 0x14d1:
    case 0x14d6:
    case BuiltInHitTKHR|BuiltInClipDistance:
    case 0x14d8:
    case 0x14d9:
    case 0x14da:
    case 0x14db:
    case 0x14dc:
    case 0x14dd:
    case 0x14de:
    case 0x14df:
    case 0x14e0:
    case 0x14e1:
    case 0x14e2:
    case 0x14e3:
    case 0x14e4:
    case 0x14e5:
    case 0x14e6:
      goto switchD_0021fe63_caseD_2;
    case BuiltInObjectToWorldKHR:
      pcVar6 = "gl_ObjectToWorldNV";
      break;
    case BuiltInWorldToObjectKHR:
      pcVar6 = "gl_WorldToObjectNV";
      break;
    case BuiltInHitTKHR:
      pcVar6 = "gl_HitTNV";
      break;
    case BuiltInHitKindKHR:
      pcVar6 = "gl_HitKindNV";
      break;
    case BuiltInIncomingRayFlagsKHR:
      pcVar6 = "gl_IncomingRayFlagsNV";
      break;
    default:
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &switchD_0021feb1::switchdataD_00303868;
      switch(builtin) {
      case BuiltInSubgroupEqMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar6 = "gl_SubgroupEqMask";
        break;
      case BuiltInSubgroupGeMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar6 = "gl_SubgroupGeMask";
        break;
      case BuiltInSubgroupGtMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar6 = "gl_SubgroupGtMask";
        break;
      case BuiltInSubgroupLeMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar6 = "gl_SubgroupLeMask";
        break;
      case BuiltInSubgroupLtMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar6 = "gl_SubgroupLtMask";
        break;
      case BuiltInSubgroupLtMask|BuiltInPointSize:
      case 0x1146:
      case BuiltInSubgroupLtMask|BuiltInClipDistance:
      case BuiltInDrawIndex|BuiltInPointSize:
      case BuiltInBaseVertex|BuiltInCullDistance:
      case BuiltInBaseVertex|BuiltInVertexId:
      case BuiltInBaseVertex|BuiltInInstanceId:
      case BuiltInBaseVertex|BuiltInPrimitiveId:
      case BuiltInSubgroupEqMask|BuiltInPointCoord:
      case BuiltInSubgroupEqMask|BuiltInFrontFacing:
      case BuiltInSubgroupEqMask|BuiltInSampleId:
      case BuiltInSubgroupEqMask|BuiltInSamplePosition:
      case BuiltInSubgroupEqMask|BuiltInSampleMask:
      case BuiltInSubgroupEqMask|BuiltInSampleMask|BuiltInPointSize:
      case BuiltInDeviceIndex|BuiltInPointSize:
        goto switchD_0021fe63_caseD_2;
      case BuiltInBaseVertex:
        if ((this->options).es == true) {
          pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_38,"BaseVertex not supported in ES profile.",&local_39);
          CompilerError::CompilerError(pCVar4,&local_38);
          __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).vulkan_semantics == true) {
          if ((this->options).version < 0x1cc) {
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar6 = "gl_BaseVertexARB";
          }
          else {
            pcVar6 = "gl_BaseVertex";
          }
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
          ::std::__cxx11::string::~string((string *)&local_38);
          pcVar6 = "SPIRV_Cross_BaseVertex";
        }
        break;
      case BuiltInBaseInstance:
        if ((this->options).es == true) {
          pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_38,"BaseInstance not supported in ES profile.",&local_39);
          CompilerError::CompilerError(pCVar4,&local_38);
          __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).vulkan_semantics == true) {
          if ((this->options).version < 0x1cc) {
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar6 = "gl_BaseInstanceARB";
          }
          else {
            pcVar6 = "gl_BaseInstance";
          }
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
          ::std::__cxx11::string::~string((string *)&local_38);
          pcVar6 = "SPIRV_Cross_BaseInstance";
        }
        break;
      case BuiltInDrawIndex:
        if ((this->options).es == true) {
          pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_38,"DrawIndex not supported in ES profile.",&local_39);
          CompilerError::CompilerError(pCVar4,&local_38);
          __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).vulkan_semantics == true) {
          if (0x1cb < (this->options).version) {
            pcVar6 = "gl_DrawID";
            break;
          }
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
        }
        ::std::__cxx11::string::~string((string *)&local_38);
        pcVar6 = "gl_DrawIDARB";
        break;
      case BuiltInDeviceIndex:
        if ((this->options).vulkan_semantics == false) {
          pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_38,"Need Vulkan semantics for device group support.",&local_39
                    );
          CompilerError::CompilerError(pCVar4,&local_38);
          __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_device_group",&local_39);
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
        pcVar6 = "gl_DeviceIndex";
        break;
      case BuiltInViewIndex:
        if ((this->options).vulkan_semantics == true) {
          ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_multiview",&local_39);
          require_extension_internal(this,&local_38);
          ::std::__cxx11::string::~string((string *)&local_38);
          pcVar6 = "gl_ViewIndex";
        }
        else {
          ::std::__cxx11::string::string((string *)&local_38,"GL_OVR_multiview2",&local_39);
          require_extension_internal(this,&local_38);
          ::std::__cxx11::string::~string((string *)&local_38);
          pcVar6 = "gl_ViewID_OVR";
        }
        break;
      default:
        if (builtin == BuiltInFragStencilRefEXT) {
          if ((this->options).es != false) {
            pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_38,"Stencil export not supported in GLES.",&local_39);
            CompilerError::CompilerError(pCVar4,&local_38);
            __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_stencil_export",&local_39);
          require_extension_internal(this,&local_38);
          ::std::__cxx11::string::~string((string *)&local_38);
          pcVar6 = "gl_FragStencilRefARB";
        }
        else if (builtin == BuiltInBaryCoordNV) {
          bVar1 = (this->options).es;
          uVar2 = (this->options).version;
          if ((uVar2 < 0x140 & bVar1) == 1) {
            pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_38,"gl_BaryCoordNV requires ESSL 320.",&local_39);
            CompilerError::CompilerError(pCVar4,&local_38);
            __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (bVar1 == false && uVar2 < 0x1c2) {
            pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_38,"gl_BaryCoordNV requires GLSL 450.",&local_39);
            CompilerError::CompilerError(pCVar4,&local_38);
            __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_NV_fragment_shader_barycentric",&local_39);
          require_extension_internal(this,&local_38);
          ::std::__cxx11::string::~string((string *)&local_38);
          pcVar6 = "gl_BaryCoordNV";
        }
        else {
          ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_0000000c,storage);
          if (builtin != BuiltInBaryCoordNoPerspNV) goto switchD_0021fe63_caseD_2;
          bVar1 = (this->options).es;
          uVar2 = (this->options).version;
          if ((uVar2 < 0x140 & bVar1) == 1) {
            pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_38,"gl_BaryCoordNoPerspNV requires ESSL 320.",&local_39);
            CompilerError::CompilerError(pCVar4,&local_38);
            __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (bVar1 == false && uVar2 < 0x1c2) {
            pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_38,"gl_BaryCoordNoPerspNV requires GLSL 450.",&local_39);
            CompilerError::CompilerError(pCVar4,&local_38);
            __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_NV_fragment_shader_barycentric",&local_39);
          require_extension_internal(this,&local_38);
          ::std::__cxx11::string::~string((string *)&local_38);
          pcVar6 = "gl_BaryCoordNoPerspNV";
        }
      }
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar6,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::builtin_to_glsl(BuiltIn builtin, StorageClass storage)
{
	switch (builtin)
	{
	case BuiltInPosition:
		return "gl_Position";
	case BuiltInPointSize:
		return "gl_PointSize";
	case BuiltInClipDistance:
		return "gl_ClipDistance";
	case BuiltInCullDistance:
		return "gl_CullDistance";
	case BuiltInVertexId:
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot implement gl_VertexID in Vulkan GLSL. This shader was created "
			                  "with GL semantics.");
		return "gl_VertexID";
	case BuiltInInstanceId:
		if (options.vulkan_semantics)
		{
			auto model = get_entry_point().model;
			switch (model)
			{
			case spv::ExecutionModelIntersectionKHR:
			case spv::ExecutionModelAnyHitKHR:
			case spv::ExecutionModelClosestHitKHR:
				// gl_InstanceID is allowed in these shaders.
				break;

			default:
				SPIRV_CROSS_THROW("Cannot implement gl_InstanceID in Vulkan GLSL. This shader was "
				                  "created with GL semantics.");
			}
		}
		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}
		return "gl_InstanceID";
	case BuiltInVertexIndex:
		if (options.vulkan_semantics)
			return "gl_VertexIndex";
		else
			return "gl_VertexID"; // gl_VertexID already has the base offset applied.
	case BuiltInInstanceIndex:
		if (options.vulkan_semantics)
			return "gl_InstanceIndex";

		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}

		if (options.vertex.support_nonzero_base_instance)
		{
			if (!options.vulkan_semantics)
			{
				// This is a soft-enable. We will opt-in to using gl_BaseInstanceARB if supported.
				require_extension_internal("GL_ARB_shader_draw_parameters");
			}
			return "(gl_InstanceID + SPIRV_Cross_BaseInstance)"; // ... but not gl_InstanceID.
		}
		else
			return "gl_InstanceID";
	case BuiltInPrimitiveId:
		if (storage == StorageClassInput && get_entry_point().model == ExecutionModelGeometry)
			return "gl_PrimitiveIDIn";
		else
			return "gl_PrimitiveID";
	case BuiltInInvocationId:
		return "gl_InvocationID";
	case BuiltInLayer:
		return "gl_Layer";
	case BuiltInViewportIndex:
		return "gl_ViewportIndex";
	case BuiltInTessLevelOuter:
		return "gl_TessLevelOuter";
	case BuiltInTessLevelInner:
		return "gl_TessLevelInner";
	case BuiltInTessCoord:
		return "gl_TessCoord";
	case BuiltInFragCoord:
		return "gl_FragCoord";
	case BuiltInPointCoord:
		return "gl_PointCoord";
	case BuiltInFrontFacing:
		return "gl_FrontFacing";
	case BuiltInFragDepth:
		return "gl_FragDepth";
	case BuiltInNumWorkgroups:
		return "gl_NumWorkGroups";
	case BuiltInWorkgroupSize:
		return "gl_WorkGroupSize";
	case BuiltInWorkgroupId:
		return "gl_WorkGroupID";
	case BuiltInLocalInvocationId:
		return "gl_LocalInvocationID";
	case BuiltInGlobalInvocationId:
		return "gl_GlobalInvocationID";
	case BuiltInLocalInvocationIndex:
		return "gl_LocalInvocationIndex";
	case BuiltInHelperInvocation:
		return "gl_HelperInvocation";

	case BuiltInBaseVertex:
		if (options.es)
			SPIRV_CROSS_THROW("BaseVertex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseVertexARB";
			}
			return "gl_BaseVertex";
		}
		else
		{
			// On regular GL, this is soft-enabled and we emit ifdefs in code.
			require_extension_internal("GL_ARB_shader_draw_parameters");
			return "SPIRV_Cross_BaseVertex";
		}
		break;

	case BuiltInBaseInstance:
		if (options.es)
			SPIRV_CROSS_THROW("BaseInstance not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseInstanceARB";
			}
			return "gl_BaseInstance";
		}
		else
		{
			// On regular GL, this is soft-enabled and we emit ifdefs in code.
			require_extension_internal("GL_ARB_shader_draw_parameters");
			return "SPIRV_Cross_BaseInstance";
		}
		break;

	case BuiltInDrawIndex:
		if (options.es)
			SPIRV_CROSS_THROW("DrawIndex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_DrawIDARB";
			}
			return "gl_DrawID";
		}
		else
		{
			// On regular GL, this is soft-enabled and we emit ifdefs in code.
			require_extension_internal("GL_ARB_shader_draw_parameters");
			return "gl_DrawIDARB";
		}
		break;

	case BuiltInSampleId:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SampleID not supported before GLSL 400.");
		return "gl_SampleID";

	case BuiltInSampleMask:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SampleMask/gl_SampleMaskIn not supported before GLSL 400.");

		if (storage == StorageClassInput)
			return "gl_SampleMaskIn";
		else
			return "gl_SampleMask";

	case BuiltInSamplePosition:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SamplePosition not supported before GLSL 400.");
		return "gl_SamplePosition";

	case BuiltInViewIndex:
		if (options.vulkan_semantics)
		{
			require_extension_internal("GL_EXT_multiview");
			return "gl_ViewIndex";
		}
		else
		{
			require_extension_internal("GL_OVR_multiview2");
			return "gl_ViewID_OVR";
		}

	case BuiltInNumSubgroups:
		request_subgroup_feature(ShaderSubgroupSupportHelper::NumSubgroups);
		return "gl_NumSubgroups";

	case BuiltInSubgroupId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupID);
		return "gl_SubgroupID";

	case BuiltInSubgroupSize:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupSize);
		return "gl_SubgroupSize";

	case BuiltInSubgroupLocalInvocationId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInvocationID);
		return "gl_SubgroupInvocationID";

	case BuiltInSubgroupEqMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupEqMask";

	case BuiltInSubgroupGeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGeMask";

	case BuiltInSubgroupGtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGtMask";

	case BuiltInSubgroupLeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLeMask";

	case BuiltInSubgroupLtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLtMask";

	case BuiltInLaunchIdNV:
		return "gl_LaunchIDNV";
	case BuiltInLaunchSizeNV:
		return "gl_LaunchSizeNV";
	case BuiltInWorldRayOriginNV:
		return "gl_WorldRayOriginNV";
	case BuiltInWorldRayDirectionNV:
		return "gl_WorldRayDirectionNV";
	case BuiltInObjectRayOriginNV:
		return "gl_ObjectRayOriginNV";
	case BuiltInObjectRayDirectionNV:
		return "gl_ObjectRayDirectionNV";
	case BuiltInRayTminNV:
		return "gl_RayTminNV";
	case BuiltInRayTmaxNV:
		return "gl_RayTmaxNV";
	case BuiltInInstanceCustomIndexNV:
		return "gl_InstanceCustomIndexNV";
	case BuiltInObjectToWorldNV:
		return "gl_ObjectToWorldNV";
	case BuiltInWorldToObjectNV:
		return "gl_WorldToObjectNV";
	case BuiltInHitTNV:
		return "gl_HitTNV";
	case BuiltInHitKindNV:
		return "gl_HitKindNV";
	case BuiltInIncomingRayFlagsNV:
		return "gl_IncomingRayFlagsNV";

	case BuiltInBaryCoordNV:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordNV requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordNV requires GLSL 450.");
		require_extension_internal("GL_NV_fragment_shader_barycentric");
		return "gl_BaryCoordNV";
	}

	case BuiltInBaryCoordNoPerspNV:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspNV requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspNV requires GLSL 450.");
		require_extension_internal("GL_NV_fragment_shader_barycentric");
		return "gl_BaryCoordNoPerspNV";
	}

	case BuiltInFragStencilRefEXT:
	{
		if (!options.es)
		{
			require_extension_internal("GL_ARB_shader_stencil_export");
			return "gl_FragStencilRefARB";
		}
		else
			SPIRV_CROSS_THROW("Stencil export not supported in GLES.");
	}

	case BuiltInDeviceIndex:
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Need Vulkan semantics for device group support.");
		require_extension_internal("GL_EXT_device_group");
		return "gl_DeviceIndex";

	default:
		return join("gl_BuiltIn_", convert_to_string(builtin));
	}
}